

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

void print_custom_message(object *obj,char *string,wchar_t msg_type,player *p)

{
  int iVar1;
  char *pcVar2;
  ushort **ppuVar3;
  size_t sVar4;
  size_t sVar5;
  byte bVar6;
  byte *pbVar7;
  size_t end;
  char buf [1024];
  size_t local_458;
  object *local_450;
  wchar_t local_444;
  player *local_440;
  char local_438 [1032];
  
  local_450 = obj;
  memset(local_438,0,0x400);
  local_458 = 0;
  if (string != (char *)0x0) {
    pcVar2 = strchr(string,0x7b);
    local_444 = msg_type;
    if (pcVar2 != (char *)0x0) {
      local_440 = p;
      do {
        strnfcat(local_438,0x400,&local_458,"%.*s",(ulong)(uint)((int)pcVar2 - (int)string),string);
        string = pcVar2 + 1;
        bVar6 = pcVar2[1];
        if (bVar6 != 0) {
          ppuVar3 = __ctype_b_loc();
          pbVar7 = (byte *)(pcVar2 + 2);
LAB_0019ce0d:
          if ((*(byte *)((long)*ppuVar3 + (ulong)bVar6 * 2 + 1) & 4) != 0) goto code_r0x0019ce18;
          if (bVar6 != 0x7d) goto switchD_0019cec8_default;
          iVar1 = strncmp(string,"name",4);
          if (iVar1 == 0) {
            iVar1 = 1;
          }
          else {
            iVar1 = strncmp(string,"kind",4);
            if (iVar1 == 0) {
              iVar1 = 2;
            }
            else {
              iVar1 = 3;
              if (*string != 0x73) {
                iVar1 = strncmp(string,"is",2);
                iVar1 = (uint)(iVar1 == 0) << 2;
              }
            }
          }
          string = (char *)pbVar7;
          switch(iVar1) {
          case 1:
            if (local_450 == (object *)0x0) goto LAB_0019cf8e;
            sVar4 = object_desc(local_438,0x400,local_450,0x40,local_440);
            local_458 = local_458 + sVar4;
            goto switchD_0019cec8_default;
          case 2:
            if (local_450 != (object *)0x0) {
              object_kind_name(local_438 + local_458,0x400 - local_458,local_450->kind,true);
              sVar4 = local_458;
              sVar5 = strlen(local_438 + local_458);
              local_458 = sVar5 + sVar4;
              goto switchD_0019cec8_default;
            }
LAB_0019cf8e:
            pcVar2 = "hands";
            break;
          case 3:
            if ((local_450 == (object *)0x0) || (local_450->number != '\x01'))
            goto switchD_0019cec8_default;
            pcVar2 = "s";
            break;
          case 4:
            if ((local_450 == (object *)0x0) || (1 < local_450->number)) {
              pcVar2 = "are";
            }
            else {
              pcVar2 = "is";
            }
            break;
          default:
            goto switchD_0019cec8_default;
          }
          strnfcat(local_438,0x400,&local_458,pcVar2);
        }
switchD_0019cec8_default:
        pcVar2 = strchr(string,0x7b);
      } while (pcVar2 != (char *)0x0);
    }
    strnfcat(local_438,0x400,&local_458,"%s",string);
    msgt(local_444,"%s",local_438);
  }
  return;
code_r0x0019ce18:
  bVar6 = *pbVar7;
  pbVar7 = pbVar7 + 1;
  if (bVar6 == 0) goto switchD_0019cec8_default;
  goto LAB_0019ce0d;
}

Assistant:

void print_custom_message(const struct object *obj, const char *string,
		int msg_type, const struct player *p)
{
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	size_t end = 0;

	/* Not always a string */
	if (!string) return;

	next = strchr(string, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - string),
			string);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			string = s + 1;

			switch(msg_tag_lookup(tag)) {
			case MSG_TAG_NAME:
				if (obj) {
					end += object_desc(buf, 1024, obj,
						ODESC_PREFIX | ODESC_BASE, p);
				} else {
					strnfcat(buf, 1024, &end, "hands");
				}
				break;
			case MSG_TAG_KIND:
				if (obj) {
					object_kind_name(&buf[end], 1024 - end, obj->kind, true);
					end += strlen(&buf[end]);
				} else {
					strnfcat(buf, 1024, &end, "hands");
				}
				break;
			case MSG_TAG_VERB:
				if (obj && obj->number == 1) {
					strnfcat(buf, 1024, &end, "s");
				}
				break;
			case MSG_TAG_VERB_IS:
				if ((!obj) || (obj->number > 1)) {
					strnfcat(buf, 1024, &end, "are");
				} else {
					strnfcat(buf, 1024, &end, "is");
				}
			default:
				break;
			}
		} else
			/* An invalid tag, skip it */
			string = next + 1;

		next = strchr(string, '{');
	}
	strnfcat(buf, 1024, &end, "%s", string);

	msgt(msg_type, "%s", buf);
}